

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_forcewear(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *astr;
  CHAR_DATA *obj_00;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_RDI;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  char arg1 [4608];
  char *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  OBJ_DATA *in_stack_ffffffffffffee00;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  astr = one_argument(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
  bVar1 = str_cmp(&stack0xffffffffffffede8,"");
  if ((((bVar1) && (bVar1 = str_cmp(astr,""), bVar1)) &&
      (obj_00 = get_char_room(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0),
      obj_00 != (CHAR_DATA *)0x0)) &&
     (ch_00 = (CHAR_DATA *)get_obj_carry(in_RDI,astr,in_stack_ffffffffffffffe8),
     ch_00 != (CHAR_DATA *)0x0)) {
    obj_from_char(in_stack_ffffffffffffee00);
    obj_to_char((OBJ_DATA *)obj_00,ch_00);
    act(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,obj_00,ch_00,0);
    act(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,obj_00,ch_00,0);
    act(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,obj_00,ch_00,0);
    do_wear((CHAR_DATA *)arg1._0_8_,(char *)victim);
  }
  else {
    send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
  }
  return;
}

Assistant:

void do_forcewear(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL];
	CHAR_DATA *victim;
	OBJ_DATA *obj;

	argument = one_argument(argument, arg1);

	if (!str_cmp(arg1, "")
		|| !str_cmp(argument, "")
		|| !(victim = get_char_room(ch, arg1))
		|| !(obj = get_obj_carry(ch, argument, ch)))
	{
		send_to_char("forcewear <character> <item in your inv>\n\r", ch);
		return;
	}

	obj_from_char(obj);
	obj_to_char(obj, victim);

	act("You put $p on $N.", ch, obj, victim, TO_CHAR);
	act("$n puts $p on you.", ch, obj, victim, TO_VICT);
	act("$n puts $p on $N.", ch, obj, victim, TO_NOTVICT);

	do_wear(victim, obj->name);
}